

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_set_dscp.c
# Opt level: O3

int os_fd_generic_set_dscp(os_fd *sock,int dscp,_Bool ipv6)

{
  int iVar1;
  undefined7 in_register_00000011;
  int __level;
  undefined1 local_4 [4];
  
  if ((int)CONCAT71(in_register_00000011,ipv6) == 0) {
    __level = 0;
    iVar1 = 1;
  }
  else {
    __level = 0x29;
    iVar1 = 0x43;
  }
  iVar1 = setsockopt(sock->fd,__level,iVar1,local_4,4);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
os_fd_generic_set_dscp(struct os_fd *sock, int dscp, bool ipv6) {
  if (ipv6) {
    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_TCLASS, (char *)&dscp, sizeof(dscp)) < 0) {
      return -1;
    }
  }
  else {
    if (setsockopt(sock->fd, IPPROTO_IP, IP_TOS, (char *)&dscp, sizeof(dscp)) < 0) {
      return -1;
    }
  }
  return 0;
}